

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaNewNOTATIONValue(xmlChar *name,xmlChar *ns)

{
  xmlSchemaValPtr val;
  xmlChar *ns_local;
  xmlChar *name_local;
  
  name_local = (xmlChar *)xmlSchemaNewValue(XML_SCHEMAS_NOTATION);
  if ((xmlSchemaValPtr)name_local == (xmlSchemaValPtr)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else {
    (((xmlSchemaValPtr)name_local)->value).qname.name = name;
    if (ns != (xmlChar *)0x0) {
      (((xmlSchemaValPtr)name_local)->value).qname.uri = ns;
    }
  }
  return (xmlSchemaValPtr)name_local;
}

Assistant:

xmlSchemaValPtr
xmlSchemaNewNOTATIONValue(const xmlChar *name,
			  const xmlChar *ns)
{
    xmlSchemaValPtr val;

    val = xmlSchemaNewValue(XML_SCHEMAS_NOTATION);
    if (val == NULL)
	return (NULL);

    val->value.qname.name = (xmlChar *)name;
    if (ns != NULL)
	val->value.qname.uri = (xmlChar *)ns;
    return(val);
}